

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::debug::StackTrace::StackTraceEntry::~StackTraceEntry(StackTraceEntry *this)

{
  long in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x68));
  std::__cxx11::string::~string((string *)(in_RDI + 0x48));
  std::__cxx11::string::~string((string *)(in_RDI + 0x28));
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  return;
}

Assistant:

StackTraceEntry(std::size_t index, char* loc) :
      m_index(index),
      m_location(loc) {
    }